

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O3

void jpeg_write_tables(j_compress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  (*cinfo->err->reset_error_mgr)((j_common_ptr)cinfo);
  (*cinfo->dest->init_destination)(cinfo);
  jinit_marker_writer(cinfo);
  (*cinfo->marker->write_tables_only)(cinfo);
  (*cinfo->dest->term_destination)(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_tables (j_compress_ptr cinfo)
{
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* (Re)initialize error mgr and destination modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr) cinfo);
  (*cinfo->dest->init_destination) (cinfo);
  /* Initialize the marker writer ... bit of a crock to do it here. */
  jinit_marker_writer(cinfo);
  /* Write them tables! */
  (*cinfo->marker->write_tables_only) (cinfo);
  /* And clean up. */
  (*cinfo->dest->term_destination) (cinfo);
  /*
   * In library releases up through v6a, we called jpeg_abort() here to free
   * any working memory allocated by the destination manager and marker
   * writer.  Some applications had a problem with that: they allocated space
   * of their own from the library memory manager, and didn't want it to go
   * away during write_tables.  So now we do nothing.  This will cause a
   * memory leak if an app calls write_tables repeatedly without doing a full
   * compression cycle or otherwise resetting the JPEG object.  However, that
   * seems less bad than unexpectedly freeing memory in the normal case.
   * An app that prefers the old behavior can call jpeg_abort for itself after
   * each call to jpeg_write_tables().
   */
}